

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

parser * init_parse_ui_entry(void)

{
  parser *p;
  char *fmt;
  uint uVar1;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_entry_name);
  parser_reg(p,"template str template",parse_entry_template);
  parser_reg(p,"parameter str parameter",parse_entry_parameter);
  parser_reg(p,"renderer str renderer",parse_entry_renderer);
  parser_reg(p,"combine str combine",parse_entry_combine);
  parser_reg(p,"label str label",parse_entry_label);
  uVar1 = 1;
  do {
    fmt = format("label%d str label%d",(ulong)uVar1,(ulong)uVar1);
    parser_reg(p,fmt,parse_entry_shortened_label);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xb);
  parser_reg(p,"category str category",parse_entry_category);
  parser_reg(p,"priority str priority",parse_entry_priority);
  parser_reg(p,"flags ?str flags",parse_entry_flags);
  parser_reg(p,"desc str desc",parse_entry_desc);
  return p;
}

Assistant:

static struct parser *init_parse_ui_entry(void)
{
	struct parser *p = parser_new();
	int i;

	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_entry_name);
	parser_reg(p, "template str template", parse_entry_template);
	parser_reg(p, "parameter str parameter", parse_entry_parameter);
	parser_reg(p, "renderer str renderer", parse_entry_renderer);
	parser_reg(p, "combine str combine", parse_entry_combine);
	parser_reg(p, "label str label", parse_entry_label);
	for (i = 1; i <= MAX_SHORTENED; ++i) {
		parser_reg(p, format("label%d str label%d", i, i),
			parse_entry_shortened_label);
	}
	parser_reg(p, "category str category", parse_entry_category);
	parser_reg(p, "priority str priority", parse_entry_priority);
	parser_reg(p, "flags ?str flags", parse_entry_flags);
	parser_reg(p, "desc str desc", parse_entry_desc);
	return p;
}